

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::analysis::LivenessManager::GetLocOffset
          (LivenessManager *this,uint32_t index,uint32_t agg_type_id)

{
  undefined8 *puVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  TypeManager *this_00;
  Type *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar6;
  undefined8 *puVar7;
  bool bVar8;
  
  this_00 = IRContext::get_type_mgr(this->ctx_);
  pTVar5 = TypeManager::GetType(this_00,agg_type_id);
  iVar2 = (*pTVar5->_vptr_Type[0x18])(pTVar5);
  lVar6 = CONCAT44(extraout_var,iVar2);
  if (lVar6 == 0) {
    iVar2 = (*pTVar5->_vptr_Type[0x1e])(pTVar5);
    lVar6 = CONCAT44(extraout_var_00,iVar2);
    if (lVar6 != 0) {
      puVar7 = *(undefined8 **)(lVar6 + 0x28);
      puVar1 = *(undefined8 **)(lVar6 + 0x30);
      uVar3 = 0;
      while( true ) {
        bVar8 = index == 0;
        index = index - 1;
        if (puVar7 == puVar1) {
          return uVar3;
        }
        if (bVar8) break;
        uVar4 = GetLocSize(this,(Type *)*puVar7);
        uVar3 = uVar3 + uVar4;
        puVar7 = puVar7 + 1;
      }
      return uVar3;
    }
    iVar2 = (*pTVar5->_vptr_Type[0x10])(pTVar5);
    lVar6 = CONCAT44(extraout_var_01,iVar2);
    if (lVar6 == 0) {
      iVar2 = (*pTVar5->_vptr_Type[0xe])(pTVar5);
      if (CONCAT44(extraout_var_02,iVar2) == 0) {
        __assert_fail("vec_type && \"unexpected non-aggregate type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/liveness.cpp"
                      ,0xa5,
                      "uint32_t spvtools::opt::analysis::LivenessManager::GetLocOffset(uint32_t, uint32_t) const"
                     );
      }
      lVar6 = (**(code **)(**(long **)(CONCAT44(extraout_var_02,iVar2) + 0x28) + 0x60))();
      if (((lVar6 != 0) && (1 < index)) && (*(int *)(lVar6 + 0x24) == 0x40)) {
        return 1;
      }
      return 0;
    }
  }
  uVar3 = GetLocSize(this,*(Type **)(lVar6 + 0x28));
  return uVar3 * index;
}

Assistant:

uint32_t LivenessManager::GetLocOffset(uint32_t index,
                                       uint32_t agg_type_id) const {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  const analysis::Type* agg_type = type_mgr->GetType(agg_type_id);
  auto arr_type = agg_type->AsArray();
  if (arr_type) return index * GetLocSize(arr_type->element_type());
  auto struct_type = agg_type->AsStruct();
  if (struct_type) {
    uint32_t offset = 0u;
    uint32_t cnt = 0u;
    for (auto& el_type : struct_type->element_types()) {
      if (cnt == index) break;
      offset += GetLocSize(el_type);
      ++cnt;
    }
    return offset;
  }
  auto mat_type = agg_type->AsMatrix();
  if (mat_type) return index * GetLocSize(mat_type->element_type());
  auto vec_type = agg_type->AsVector();
  assert(vec_type && "unexpected non-aggregate type");
  auto comp_type = vec_type->element_type();
  auto flt_type = comp_type->AsFloat();
  if (flt_type && flt_type->width() == 64u && index >= 2u) return 1;
  return 0;
}